

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

void swrenderer::R_Subsector(subsector_t *sub)

{
  ushort uVar1;
  FTextureID FVar2;
  sector_t_conflict *psVar3;
  secplane_t *psVar4;
  visplane_t *pvVar5;
  double dVar6;
  int iVar7;
  long lVar8;
  FMiniBSP *pFVar9;
  FSectorPortal *pFVar10;
  visplane_t *pvVar11;
  lightlist_t *plVar12;
  WORD *pWVar13;
  extsector_t *peVar14;
  uint uVar15;
  seg_t *line;
  int i;
  DWORD DVar16;
  ulong uVar17;
  uint i_2;
  subsector_t *psVar18;
  bool bVar19;
  int ceilinglightlevel;
  int floorlightlevel;
  visplane_t *local_270;
  visplane_t *local_268;
  visplane_t *local_260;
  visplane_t *local_258;
  subsector_t *local_250;
  sector_t_conflict local_248;
  
  psVar18 = InSubsector;
  if ((InSubsector == (subsector_t *)0x0) &&
     (lVar8 = ((long)sub - (long)subsectors) / 0x30, InSubsector = sub, numsubsectors <= lVar8)) {
    I_Error("R_Subsector: ss %ti with numss = %i",lVar8);
  }
  psVar3 = sub->sector;
  if (psVar3 == (sector_t_conflict *)0x0) {
    __assert_fail("sub->sector != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_bsp.cpp"
                  ,0x42d,"void swrenderer::R_Subsector(subsector_t *)");
  }
  if (sub->polys != (FPolyNode *)0x0) {
    pFVar9 = sub->BSP;
    if ((pFVar9 == (FMiniBSP *)0x0) || (pFVar9->bDirty == true)) {
      subsector_t::BuildPolyBSP(sub);
      pFVar9 = sub->BSP;
    }
    uVar15 = (pFVar9->Nodes).Count;
    if (uVar15 == 0) {
      R_Subsector((pFVar9->Subsectors).Array);
    }
    else {
      R_RenderBSPNode((pFVar9->Nodes).Array + (uVar15 - 1));
    }
    goto LAB_002f83ff;
  }
  frontsector = psVar3;
  *(byte *)&psVar3->MoreFlags = (byte)psVar3->MoreFlags | 0x80;
  frontsector = R_FakeFlat(psVar3,&local_248,&floorlightlevel,&ceilinglightlevel,false);
  foggy = '\x01';
  if ((level.fadeto == 0) && ((frontsector->ColorMap->Fade).field_0.d == 0)) {
    foggy = (char)((level.flags & 8) >> 3);
  }
  r_actualextralight = extralight << 4;
  if (foggy != '\0') {
    r_actualextralight = 0;
  }
  local_260 = (visplane_t *)CONCAT44(local_260._4_4_,floorlightlevel);
  local_268 = (visplane_t *)CONCAT44(local_268._4_4_,ceilinglightlevel);
  if (fixedlightlev < 0) {
    if ((frontsector->e == (extsector_t *)0x0) || ((frontsector->e->XFloor).lightlist.Count == 0))
    goto LAB_002f8472;
    plVar12 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
    basecolormap = plVar12->extra_colormap;
    if (plVar12->p_lightlevel != &frontsector->lightlevel) {
      ceilinglightlevel = (int)*plVar12->p_lightlevel;
    }
  }
  else if (r_fullbrightignoresectorcolor.Value == false) {
LAB_002f8472:
    basecolormap = frontsector->ColorMap;
  }
  else {
    basecolormap = &FullNormalLight;
  }
  pFVar10 = sector_t::ValidatePortal((sector_t *)frontsector,1);
  iVar7 = secplane_t::PointOnSide(&frontsector->ceilingplane,&ViewPos);
  FVar2.texnum = frontsector->planes[1].Texture.texnum;
  if (((iVar7 < 1) && (pFVar10 == (FSectorPortal *)0x0 && FVar2.texnum != skyflatnum.texnum)) &&
     ((psVar3 = frontsector->heightsec, psVar3 == (sector_t_conflict *)0x0 ||
      (((psVar3->MoreFlags & 0x10) != 0 || (psVar3->planes[0].Texture.texnum != skyflatnum.texnum)))
      ))) {
    ceilingplane = (visplane_t *)0x0;
  }
  else {
    ceilingplane = R_FindPlane(&frontsector->ceilingplane,FVar2,
                               r_actualextralight + ceilinglightlevel,frontsector->planes[1].alpha,
                               SUB41((frontsector->planes[1].Flags & 4U) >> 2,0),
                               &frontsector->planes[1].xform,frontsector->sky,pFVar10);
  }
  if (fixedlightlev < 0) {
    if ((frontsector->e == (extsector_t *)0x0) || ((frontsector->e->XFloor).lightlist.Count == 0))
    goto LAB_002f8592;
    plVar12 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
    basecolormap = plVar12->extra_colormap;
    if (plVar12->p_lightlevel != &frontsector->lightlevel) {
      floorlightlevel = (int)*plVar12->p_lightlevel;
    }
  }
  else if (r_fullbrightignoresectorcolor.Value == false) {
LAB_002f8592:
    basecolormap = frontsector->ColorMap;
  }
  else {
    basecolormap = &FullNormalLight;
  }
  pFVar10 = sector_t::ValidatePortal((sector_t *)frontsector,0);
  iVar7 = secplane_t::PointOnSide(&frontsector->floorplane,&ViewPos);
  FVar2.texnum = frontsector->planes[0].Texture.texnum;
  if (((iVar7 < 1) && (pFVar10 == (FSectorPortal *)0x0 && FVar2.texnum != skyflatnum.texnum)) &&
     ((psVar3 = frontsector->heightsec, psVar3 == (sector_t_conflict *)0x0 ||
      (((psVar3->MoreFlags & 0x10) != 0 || (psVar3->planes[1].Texture.texnum != skyflatnum.texnum)))
      ))) {
    pvVar11 = (visplane_t *)0x0;
  }
  else {
    pvVar11 = R_FindPlane(&frontsector->floorplane,FVar2,r_actualextralight + floorlightlevel,
                          frontsector->planes[0].alpha,
                          SUB41((frontsector->planes[0].Flags & 4U) >> 2,0),
                          (FTransform *)frontsector,frontsector->sky,pFVar10);
  }
  floorplane = pvVar11;
  if (((r_3dfloors.Value != 0) && (peVar14 = frontsector->e, peVar14 != (extsector_t *)0x0)) &&
     (uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count, uVar15 != 0)) {
    local_258 = ceilingplane;
    for (lVar8 = 0; lVar8 < (int)uVar15; lVar8 = lVar8 + 1) {
      fakeFloor = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar8];
      uVar15 = fakeFloor->flags;
      if ((((uVar15 & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
         (psVar4 = (fakeFloor->bottom).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0
         )) {
        if ((uVar15 & 0x2c) != 0x20) {
          R_3D_AddHeight((fakeFloor->top).plane,(sector_t *)frontsector);
          uVar15 = fakeFloor->flags;
        }
        if (((uVar15 & 8) != 0) && ((~uVar15 & 0x40400000) != 0 && (long)fakeFloor->alpha != 0)) {
          fakeAlpha = (int)(((long)fakeFloor->alpha << 0x10) / 0xff);
          if (0xffff < fakeAlpha) {
            fakeAlpha = 0x10000;
          }
          if (fakeFloor->validcount != validcount) {
            fakeFloor->validcount = validcount;
            R_3D_NewClip();
          }
          pvVar5 = (visplane_t *)
                   secplane_t::ZatPoint((fakeFloor->top).plane,&frontsector->centerspot);
          if (((double)pvVar5 < ViewPos.Z) &&
             (local_270 = pvVar5,
             dVar6 = secplane_t::ZatPoint(&frontsector->floorplane,&frontsector->centerspot),
             dVar6 < (double)local_270)) {
            fake3D = 1;
            local_270 = pvVar11;
            sector_t::operator=((sector_t *)&local_248,(sector_t_conflict *)fakeFloor->model);
            psVar4 = (fakeFloor->top).plane;
            local_248.floorplane.normal.Z = (psVar4->normal).Z;
            local_248.floorplane.normal.X = (psVar4->normal).X;
            local_248.floorplane.normal.Y = (psVar4->normal).Y;
            local_248.floorplane.D = psVar4->D;
            local_248.floorplane.negiC = psVar4->negiC;
            psVar4 = (fakeFloor->bottom).plane;
            local_248.ceilingplane.normal.Z = (psVar4->normal).Z;
            local_248.ceilingplane.normal.X = (psVar4->normal).X;
            local_248.ceilingplane.normal.Y = (psVar4->normal).Y;
            local_248.ceilingplane.D = psVar4->D;
            local_248.ceilingplane.negiC = psVar4->negiC;
            bVar19 = (fakeFloor->flags & 0x40400000) == 0;
            if (bVar19) {
              sector_t::SetTexture((sector_t *)&local_248,0,local_248.planes[1].Texture,true);
            }
            frontsector = &local_248;
            if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
              plVar12 = P_GetPlaneLight(sub->sector,&local_248.floorplane,false);
              basecolormap = plVar12->extra_colormap;
              floorlightlevel = (int)*plVar12->p_lightlevel;
            }
            ceilingplane = (visplane_t *)0x0;
            floorplane = R_FindPlane(&frontsector->floorplane,
                                     (FTextureID)frontsector->planes[0].Texture.texnum,
                                     r_actualextralight + floorlightlevel,
                                     frontsector->planes[0].alpha,
                                     (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                     &frontsector->planes[bVar19].xform,frontsector->sky,
                                     (FSectorPortal *)0x0);
            R_FakeDrawLoop(sub);
            fake3D = 0;
            frontsector = sub->sector;
            pvVar11 = local_270;
          }
        }
      }
      peVar14 = frontsector->e;
      uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    }
    for (uVar17 = 0; uVar17 < uVar15; uVar17 = uVar17 + 1) {
      fakeFloor = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar17];
      uVar15 = fakeFloor->flags;
      if ((((uVar15 & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
         (psVar4 = (fakeFloor->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0))
      {
        if ((uVar15 & 0x2c) != 0x20) {
          R_3D_AddHeight((fakeFloor->bottom).plane,(sector_t *)frontsector);
          uVar15 = fakeFloor->flags;
        }
        if (((uVar15 & 8) != 0) &&
           ((uVar15 & 0x40400010) != 0x400010 && (long)fakeFloor->alpha != 0)) {
          fakeAlpha = (int)(((long)fakeFloor->alpha << 0x10) / 0xff);
          if (0xffff < fakeAlpha) {
            fakeAlpha = 0x10000;
          }
          if (fakeFloor->validcount != validcount) {
            fakeFloor->validcount = validcount;
            R_3D_NewClip();
          }
          pvVar5 = (visplane_t *)
                   secplane_t::ZatPoint((fakeFloor->bottom).plane,&frontsector->centerspot);
          if ((ViewPos.Z < (double)pvVar5) &&
             (local_270 = pvVar5,
             dVar6 = secplane_t::ZatPoint(&frontsector->ceilingplane,&frontsector->centerspot),
             (double)local_270 < dVar6)) {
            fake3D = 2;
            local_270 = pvVar11;
            sector_t::operator=((sector_t *)&local_248,(sector_t_conflict *)fakeFloor->model);
            psVar4 = (fakeFloor->top).plane;
            local_248.floorplane.normal.Z = (psVar4->normal).Z;
            local_248.floorplane.normal.X = (psVar4->normal).X;
            local_248.floorplane.normal.Y = (psVar4->normal).Y;
            local_248.floorplane.D = psVar4->D;
            local_248.floorplane.negiC = psVar4->negiC;
            psVar4 = (fakeFloor->bottom).plane;
            local_248.ceilingplane.normal.Z = (psVar4->normal).Z;
            local_248.ceilingplane.normal.X = (psVar4->normal).X;
            local_248.ceilingplane.normal.Y = (psVar4->normal).Y;
            local_248.ceilingplane.negiC = psVar4->negiC;
            uVar15 = fakeFloor->flags & 0x40400000;
            if ((uVar15 == 0x40400000) || (lVar8 = 1, uVar15 == 0)) {
              local_248.planes[1].Texture.texnum = local_248.planes[0].Texture.texnum;
              lVar8 = 0;
            }
            frontsector = &local_248;
            dVar6 = local_248.ceilingplane.normal.Z * 1.52587890625e-05;
            local_248.ceilingplane.D = psVar4->D + dVar6;
            if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
              plVar12 = P_GetPlaneLight(sub->sector,&local_248.ceilingplane,false);
              basecolormap = plVar12->extra_colormap;
              ceilinglightlevel = (int)*plVar12->p_lightlevel;
              dVar6 = local_248.ceilingplane.normal.Z * 1.52587890625e-05;
            }
            local_248.ceilingplane.D = local_248.ceilingplane.D - dVar6;
            floorplane = (visplane_t *)0x0;
            ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                       (FTextureID)frontsector->planes[1].Texture.texnum,
                                       r_actualextralight + ceilinglightlevel,
                                       frontsector->planes[1].alpha,
                                       (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                       &frontsector->planes[lVar8].xform,frontsector->sky,
                                       (FSectorPortal *)0x0);
            R_FakeDrawLoop(sub);
            fake3D = 0;
            frontsector = sub->sector;
            pvVar11 = local_270;
          }
        }
      }
      peVar14 = frontsector->e;
      uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    }
    fakeFloor = (F3DFloor *)0x0;
    ceilingplane = local_258;
    floorplane = pvVar11;
  }
  basecolormap = frontsector->ColorMap;
  floorlightlevel = (int)local_260;
  ceilinglightlevel = (int)local_268;
  iVar7 = (int)local_260;
  if (frontsector->planes[1].Texture.texnum == skyflatnum.texnum) {
    iVar7 = (int)local_268;
  }
  R_AddSprites(sub->sector,iVar7,(uint)FakeSide);
  uVar17 = ((long)sub - (long)subsectors) / 0x30;
  if ((uint)uVar17 < (uint)numsubsectors) {
    iVar7 = (ceilinglightlevel + floorlightlevel) / 2 + r_actualextralight;
    pWVar13 = ParticlesInSubsec.Array + (uVar17 & 0xffffffff);
    while (uVar1 = *pWVar13, uVar1 != 0xffff) {
      R_ProjectParticle(Particles + uVar1,sub->sector,iVar7 * -0x4000 + 0x3d0000,(uint)FakeSide);
      pWVar13 = &Particles[uVar1].snext;
    }
  }
  DVar16 = sub->numlines;
  line = sub->firstline;
  local_250 = psVar18;
  while (bVar19 = DVar16 != 0, DVar16 = DVar16 - 1, bVar19) {
    if (((psVar18 != (subsector_t *)0x0) || (line->sidedef == (side_t *)0x0)) ||
       ((line->sidedef->Flags & 0x40) == 0)) {
      if (((r_3dfloors.Value != 0) && (line->backsector != (sector_t_conflict *)0x0)) &&
         (frontsector->e != (extsector_t *)0x0)) {
        peVar14 = line->backsector->e;
        uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        if (uVar15 != 0) {
          local_260 = floorplane;
          local_268 = ceilingplane;
          floorplane = (visplane_t *)0x0;
          ceilingplane = (visplane_t *)0x0;
          for (uVar17 = 0; uVar17 < uVar15; uVar17 = uVar17 + 1) {
            fakeFloor = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar17]
            ;
            if (((~fakeFloor->flags & 9) == 0) &&
               ((sector_t_conflict *)fakeFloor->model != (sector_t_conflict *)0x0)) {
              fake3D = 4;
              sector_t::operator=((sector_t *)&local_248,(sector_t_conflict *)fakeFloor->model);
              psVar4 = (fakeFloor->top).plane;
              local_248.floorplane.normal.Z = (psVar4->normal).Z;
              local_248.floorplane.normal.X = (psVar4->normal).X;
              local_248.floorplane.normal.Y = (psVar4->normal).Y;
              local_248.floorplane.D = psVar4->D;
              local_248.floorplane.negiC = psVar4->negiC;
              psVar4 = (fakeFloor->bottom).plane;
              local_248.ceilingplane.normal.Z = (psVar4->normal).Z;
              local_248.ceilingplane.normal.X = (psVar4->normal).X;
              local_248.ceilingplane.normal.Y = (psVar4->normal).Y;
              local_248.ceilingplane.D = psVar4->D;
              local_248.ceilingplane.negiC = psVar4->negiC;
              backsector = &local_248;
              if (fakeFloor->validcount != validcount) {
                fakeFloor->validcount = validcount;
                R_3D_NewClip();
              }
              R_AddLine(line);
              peVar14 = line->backsector->e;
              uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            }
          }
          fakeFloor = (F3DFloor *)0x0;
          fake3D = 0;
          floorplane = local_260;
          ceilingplane = local_268;
          psVar18 = local_250;
        }
      }
      R_AddLine(line);
    }
    line = line + 1;
  }
LAB_002f83ff:
  if (psVar18 == (subsector_t *)0x0) {
    InSubsector = (subsector_t *)0x0;
  }
  return;
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = (r_fullbrightignoresectorcolor && fixedlightlev >= 0) ? &FullNormalLight : frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = (r_fullbrightignoresectorcolor && fixedlightlev >= 0) ? &FullNormalLight : frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}